

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

token * new_token(token_type ttype,void *token,int pdepth,_Bool not)

{
  token *ptVar1;
  token *tok;
  _Bool not_local;
  int pdepth_local;
  void *token_local;
  token_type ttype_local;
  
  ptVar1 = (token *)mem_zalloc(0x18);
  ptVar1->type = ttype;
  ptVar1->token = token;
  ptVar1->pdepth = pdepth;
  ptVar1->not = not;
  return ptVar1;
}

Assistant:

static struct token *new_token(
    enum token_type ttype, void *token, int pdepth, bool not )
{
    struct token *tok = mem_zalloc(sizeof(struct token));
    tok->type         = ttype;
    tok->token        = token;
    tok->pdepth       = pdepth;
    tok->not          = not ;
    return tok;
}